

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprAliasDefinition * AnalyzeTypedef(ExpressionContext *ctx,SynTypedef *syntax)

{
  ScopeData *scope;
  uint uVar1;
  int iVar2;
  TypeBase *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExprAliasDefinition *pEVar4;
  char *msg;
  InplaceStr name;
  AliasData *this;
  undefined4 extraout_var_01;
  
  uVar1 = InplaceStr::hash(&syntax->alias->name);
  pTVar3 = anon_unknown.dwarf_ff84f::LookupTypeByName(ctx,uVar1);
  if (pTVar3 == (TypeBase *)0x0) {
    pTVar3 = AnalyzeType(ctx,syntax->type,true,(bool *)0x0);
    if (pTVar3 != ctx->typeAuto) {
      name = GetTypeNameInScope(ctx,ctx->scope,syntax->alias->name);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      this = (AliasData *)CONCAT44(extraout_var,iVar2);
      scope = ctx->scope;
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      SynIdentifier::SynIdentifier
                ((SynIdentifier *)CONCAT44(extraout_var_00,iVar2),syntax->alias,name);
      uVar1 = ctx->uniqueAliasId;
      ctx->uniqueAliasId = uVar1 + 1;
      AliasData::AliasData
                (this,&syntax->super_SynBase,scope,pTVar3,
                 (SynIdentifier *)CONCAT44(extraout_var_00,iVar2),uVar1);
      ExpressionContext::AddAlias(ctx,this);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar4 = (ExprAliasDefinition *)CONCAT44(extraout_var_01,iVar2);
      pTVar3 = ctx->typeVoid;
      (pEVar4->super_ExprBase).typeID = 0x2a;
      (pEVar4->super_ExprBase).source = &syntax->super_SynBase;
      (pEVar4->super_ExprBase).type = pTVar3;
      (pEVar4->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar4->super_ExprBase).listed = false;
      (pEVar4->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3f68;
      pEVar4->alias = this;
      return pEVar4;
    }
    msg = "ERROR: can\'t alias \'auto\' type";
  }
  else {
    msg = "ERROR: there is already a type or an alias with the same name";
  }
  anon_unknown.dwarf_ff84f::Stop(ctx,&syntax->super_SynBase,msg);
}

Assistant:

ExprAliasDefinition* AnalyzeTypedef(ExpressionContext &ctx, SynTypedef *syntax)
{
	if(LookupTypeByName(ctx, syntax->alias->name.hash()))
		Stop(ctx, syntax, "ERROR: there is already a type or an alias with the same name");

	TypeBase *type = AnalyzeType(ctx, syntax->type);

	if(type == ctx.typeAuto)
		Stop(ctx, syntax, "ERROR: can't alias 'auto' type");

	InplaceStr aliasName = GetTypeNameInScope(ctx, ctx.scope, syntax->alias->name);

	AliasData *alias = new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, type, new (ctx.get<SynIdentifier>()) SynIdentifier(syntax->alias, aliasName), ctx.uniqueAliasId++);

	ctx.AddAlias(alias);

	return new (ctx.get<ExprAliasDefinition>()) ExprAliasDefinition(syntax, ctx.typeVoid, alias);
}